

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

void __thiscall
cfd::core::Psbt::SetTxInWitnessUtxoDirect(Psbt *this,uint32_t index,TxOutReference *txout)

{
  void *pvVar1;
  uint64_t satoshi;
  CfdException *pCVar2;
  undefined4 in_register_00000034;
  allocator local_a5;
  int ret;
  wally_tx_output *output;
  undefined1 local_98 [8];
  int local_90;
  char *local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> script_val;
  Script script;
  
  (*this->_vptr_Psbt[2])(this,CONCAT44(in_register_00000034,index),0x92a,"SetTxInWitnessUtxoDirect")
  ;
  pvVar1 = this->wally_psbt_pointer_;
  output = (wally_tx_output *)0x0;
  Script::Script(&script,&(txout->super_AbstractTxOutReference).locking_script_);
  Script::GetData((ByteData *)local_98,&script);
  ByteData::GetBytes(&script_val,(ByteData *)local_98);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_98);
  local_98 = (undefined1  [8])(txout->super_AbstractTxOutReference).value_.amount_;
  local_90 = CONCAT31(local_90._1_3_,(txout->super_AbstractTxOutReference).value_.ignore_check_);
  satoshi = Amount::GetSatoshiValue((Amount *)local_98);
  ret = wally_tx_output_init_alloc
                  (satoshi,script_val.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,
                   (long)script_val.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)script_val.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,&output);
  if (ret != 0) {
    local_98 = (undefined1  [8])0x5e188f;
    local_90 = 0x935;
    local_88 = "SetTxInWitnessUtxoDirect";
    logger::warn<int&>((CfdSourceLocation *)local_98,"wally_tx_output_init_alloc NG[{}]",&ret);
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)local_98,"psbt alloc output error.",&local_a5);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_98);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ret = wally_psbt_input_set_witness_utxo
                  ((wally_psbt_input *)((ulong)index * 0x110 + *(long *)((long)pvVar1 + 0x10)),
                   output);
  wally_tx_output_free(output);
  if (ret == 0) {
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    Script::~Script(&script);
    return;
  }
  local_98 = (undefined1  [8])0x5e188f;
  local_90 = 0x93d;
  local_88 = "SetTxInWitnessUtxoDirect";
  logger::warn<int&>((CfdSourceLocation *)local_98,"wally_psbt_input_set_witness_utxo NG[{}]",&ret);
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_98,"psbt add witness utxo error.",&local_a5);
  CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_98);
  __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void Psbt::SetTxInWitnessUtxoDirect(
    uint32_t index, const TxOutReference &txout) {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);

  struct wally_tx_output *output = nullptr;
  auto script = txout.GetLockingScript();
  auto script_val = script.GetData().GetBytes();
  int ret = wally_tx_output_init_alloc(
      static_cast<uint64_t>(txout.GetValue().GetSatoshiValue()),
      script_val.data(), script_val.size(), &output);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_output_init_alloc NG[{}]", ret);
    throw CfdException(kCfdIllegalArgumentError, "psbt alloc output error.");
  }

  ret =
      wally_psbt_input_set_witness_utxo(&psbt_pointer->inputs[index], output);
  wally_tx_output_free(output);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_input_set_witness_utxo NG[{}]", ret);
    throw CfdException(
        kCfdIllegalArgumentError, "psbt add witness utxo error.");
  }
}